

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalParse
          (GeneratedCodeInfo_Annotation *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  uint64 uVar7;
  char cVar8;
  uint32 uVar9;
  uint tag;
  char cVar10;
  Arena *arena;
  uint uVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  pair<const_char_*,_bool> pVar14;
  byte *local_48;
  InternalMetadataWithArena *local_40;
  RepeatedField<int> *local_38;
  
  local_40 = &this->_internal_metadata_;
  this_00 = &this->source_file_;
  local_38 = &this->path_;
  uVar11 = 0;
  local_48 = (byte *)ptr;
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= local_48) {
      if ((long)local_48 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_0034f788;
      pVar14 = internal::EpsCopyInputStream::DoneFallback
                         (&ctx->super_EpsCopyInputStream,(char *)local_48,ctx->group_depth_);
      local_48 = (byte *)pVar14.first;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0034f788;
    }
    bVar1 = *local_48;
    pVar12.second._0_1_ = bVar1;
    pVar12.first = (char *)(local_48 + 1);
    pVar12._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_48[1];
      uVar9 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar12 = internal::ReadTagFallback((char *)local_48,uVar9);
      }
      else {
        pVar12.second = uVar9;
        pVar12.first = (char *)(local_48 + 2);
        pVar12._12_4_ = 0;
      }
    }
    local_48 = (byte *)pVar12.first;
    cVar10 = '\x04';
    if (local_48 != (byte *)0x0) {
      tag = pVar12.second;
      cVar8 = (char)pVar12.second;
      switch((uint)(pVar12._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar8 == '\n') {
          local_48 = (byte *)internal::PackedInt32Parser(local_38,(char *)local_48,ctx);
        }
        else {
          if ((tag & 0xff) != 8) break;
          uVar7 = internal::ReadVarint((char **)&local_48);
          _internal_add_path(this,(int32)uVar7);
        }
        if (local_48 != (byte *)0x0) {
          cVar10 = '\x02';
        }
        goto LAB_0034f763;
      case 2:
        if (cVar8 != '\x12') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        local_48 = (byte *)internal::InlineGreedyStringParser(this_00->ptr_,(char *)local_48,ctx);
        goto LAB_0034f754;
      case 3:
        if (cVar8 == '\x18') {
          bVar1 = *local_48;
          auVar3._8_8_ = (long)(char)bVar1;
          auVar3._0_8_ = local_48 + 1;
          auVar5 = auVar3._0_12_;
          if ((long)(char)bVar1 < 0) {
            bVar2 = local_48[1];
            uVar9 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar13 = internal::VarintParseSlow64((char *)local_48,uVar9);
              auVar5 = pVar13._0_12_;
            }
            else {
              auVar5._8_4_ = uVar9;
              auVar5._0_8_ = local_48 + 2;
            }
          }
          local_48 = auVar5._0_8_;
          uVar11 = uVar11 | 2;
          this->begin_ = auVar5._8_4_;
          goto LAB_0034f754;
        }
        break;
      case 4:
        if (cVar8 == ' ') {
          bVar1 = *local_48;
          auVar4._8_8_ = (long)(char)bVar1;
          auVar4._0_8_ = local_48 + 1;
          auVar6 = auVar4._0_12_;
          if ((long)(char)bVar1 < 0) {
            bVar2 = local_48[1];
            uVar9 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar13 = internal::VarintParseSlow64((char *)local_48,uVar9);
              auVar6 = pVar13._0_12_;
            }
            else {
              auVar6._8_4_ = uVar9;
              auVar6._0_8_ = local_48 + 2;
            }
          }
          local_48 = auVar6._0_8_;
          uVar11 = uVar11 | 4;
          this->end_ = auVar6._8_4_;
          goto LAB_0034f754;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar10 = '\a';
      }
      else {
        local_48 = (byte *)internal::UnknownFieldParse(tag,local_40,(char *)local_48,ctx);
LAB_0034f754:
        cVar10 = (local_48 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_0034f763:
  } while (cVar10 == '\x02');
  if (cVar10 == '\x04') {
    local_48 = (byte *)0x0;
  }
LAB_0034f788:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar11;
  return (char *)local_48;
}

Assistant:

const char* GeneratedCodeInfo_Annotation::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated int32 path = 1 [packed = true];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_path(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8) {
          _internal_add_path(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_file = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_file(), ptr, ctx, "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 begin = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_begin(&has_bits);
          begin_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}